

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStringSliceWTF(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  StringSliceWTF *pSVar1;
  bool bVar2;
  Ok local_a5;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  StringSliceWTF curr;
  IRBuilder *this_local;
  
  pSVar1 = (StringSliceWTF *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  StringSliceWTF::StringSliceWTF(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitStringSliceWTF
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_70 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_a4 == 0) {
    pSVar1 = Builder::makeStringSliceWTF
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)89>.super_Expression.
                        type.id,curr.ref,curr.start);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStringSliceWTF() {
  StringSliceWTF curr;
  CHECK_ERR(visitStringSliceWTF(&curr));
  push(builder.makeStringSliceWTF(curr.ref, curr.start, curr.end));
  return Ok{};
}